

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindLocalNonAliasGeneratorTarget(cmLocalGenerator *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  pointer pcVar2;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var3;
  cmGeneratorTarget *pcVar4;
  NamedGeneratorTargetFinder local_48;
  
  _Var3._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  paVar1 = &local_48.Name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48.Name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                    (_Var3,__last,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.Name._M_dataplus._M_p,local_48.Name.field_2._M_allocated_capacity + 1);
  }
  if (_Var3._M_current ==
      (this->GeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar4 = (cmGeneratorTarget *)0x0;
  }
  else {
    pcVar4 = *_Var3._M_current;
  }
  return pcVar4;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindLocalNonAliasGeneratorTarget(
  const std::string& name) const
{
  std::vector<cmGeneratorTarget*>::const_iterator ti =
    std::find_if(this->GeneratorTargets.begin(), this->GeneratorTargets.end(),
                 NamedGeneratorTargetFinder(name));
  if (ti != this->GeneratorTargets.end()) {
    return *ti;
  }
  return CM_NULLPTR;
}